

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

void __thiscall Lexer_Floats_Test::TestBody(Lexer_Floats_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_4b8;
  Message local_4b0;
  multi_tks local_4a4;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_20;
  Message local_488;
  double local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_19;
  Message local_460;
  multi_tks local_454;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_18;
  Message local_438;
  double local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_17;
  Message local_410;
  multi_tks local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_16;
  Message local_3e8;
  double local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_15;
  Message local_3c0;
  multi_tks local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_14;
  Message local_398;
  double local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_13;
  Message local_370;
  multi_tks local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_12;
  Message local_348;
  double local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_11;
  Message local_320;
  multi_tks local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_10;
  Message local_2f8;
  double local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_9;
  Message local_2d0;
  multi_tks local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_8;
  Message local_2a8;
  double local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_7;
  Message local_280;
  multi_tks local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_6;
  Message local_258;
  double local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_5;
  Message local_230;
  multi_tks local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_4;
  Message local_208;
  double local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_3;
  Message local_1e0;
  multi_tks local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_2;
  Message local_1b8;
  double local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_190;
  Message local_188 [3];
  multi_tks local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  MockLexer mock;
  Lexer_Floats_Test *this_local;
  
  mock.lxr.tk.field_4 = (anon_union_8_2_0c43866c_for_TkInfo_4)this;
  mock_new((MockLexer *)&gtest_ar.message_,
           "3.0 4.0000 3.1415926535 3. 42.09 3e4 3e+4 3e-4 3.14e2 42.51E2");
  lex_next((Lexer *)&mock.vm.stack_size);
  local_16c = TK_NUM;
  testing::internal::EqHelper<false>::Compare<int,multi_tks>
            ((EqHelper<false> *)local_168,"mock.lxr.tk.type","TK_NUM",&mock.lxr.cursor,&local_16c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(local_188);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_1b0 = 3.0;
    testing::internal::EqHelper<false>::Compare<double,double>
              ((EqHelper<false> *)local_1a8,"mock.lxr.tk.num","3.0",(double *)&mock.lxr.tk.length,
               &local_1b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                 ,0x9f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1b8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      lex_next((Lexer *)&mock.vm.stack_size);
      local_1d4 = TK_NUM;
      testing::internal::EqHelper<false>::Compare<int,multi_tks>
                ((EqHelper<false> *)local_1d0,"mock.lxr.tk.type","TK_NUM",&mock.lxr.cursor,
                 &local_1d4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                   ,0xa0,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1e0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_200 = 4.0;
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((EqHelper<false> *)local_1f8,"mock.lxr.tk.num","4.0",
                   (double *)&mock.lxr.tk.length,&local_200);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar1) {
          testing::Message::Message(&local_208);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                     ,0xa1,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_208);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_208);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          lex_next((Lexer *)&mock.vm.stack_size);
          local_224 = TK_NUM;
          testing::internal::EqHelper<false>::Compare<int,multi_tks>
                    ((EqHelper<false> *)local_220,"mock.lxr.tk.type","TK_NUM",&mock.lxr.cursor,
                     &local_224);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
          if (!bVar1) {
            testing::Message::Message(&local_230);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                       ,0xa2,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_230);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_230);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_250 = 3.1415926535;
            testing::internal::EqHelper<false>::Compare<double,double>
                      ((EqHelper<false> *)local_248,"mock.lxr.tk.num","3.1415926535",
                       (double *)&mock.lxr.tk.length,&local_250);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
            if (!bVar1) {
              testing::Message::Message(&local_258);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                         ,0xa3,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_258);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_258);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              lex_next((Lexer *)&mock.vm.stack_size);
              local_274 = TK_NUM;
              testing::internal::EqHelper<false>::Compare<int,multi_tks>
                        ((EqHelper<false> *)local_270,"mock.lxr.tk.type","TK_NUM",&mock.lxr.cursor,
                         &local_274);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
              if (!bVar1) {
                testing::Message::Message(&local_280);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                           ,0xa4,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_280);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_280);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                local_2a0 = 3.0;
                testing::internal::EqHelper<false>::Compare<double,double>
                          ((EqHelper<false> *)local_298,"mock.lxr.tk.num","3.0",
                           (double *)&mock.lxr.tk.length,&local_2a0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_298);
                if (!bVar1) {
                  testing::Message::Message(&local_2a8);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                             ,0xa5,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_2a8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_2a8);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                  lex_next((Lexer *)&mock.vm.stack_size);
                  local_2c4 = TK_NUM;
                  testing::internal::EqHelper<false>::Compare<int,multi_tks>
                            ((EqHelper<false> *)local_2c0,"mock.lxr.tk.type","TK_NUM",
                             &mock.lxr.cursor,&local_2c4);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2c0);
                  if (!bVar1) {
                    testing::Message::Message(&local_2d0);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                               ,0xa6,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_2d0);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_2d0);
                  }
                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                    local_2f0 = 42.09;
                    testing::internal::EqHelper<false>::Compare<double,double>
                              ((EqHelper<false> *)local_2e8,"mock.lxr.tk.num","42.09",
                               (double *)&mock.lxr.tk.length,&local_2f0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2e8);
                    if (!bVar1) {
                      testing::Message::Message(&local_2f8);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_2e8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                 ,0xa7,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_2f8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_2f8);
                    }
                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
                    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                      lex_next((Lexer *)&mock.vm.stack_size);
                      local_314 = TK_NUM;
                      testing::internal::EqHelper<false>::Compare<int,multi_tks>
                                ((EqHelper<false> *)local_310,"mock.lxr.tk.type","TK_NUM",
                                 &mock.lxr.cursor,&local_314);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_310);
                      if (!bVar1) {
                        testing::Message::Message(&local_320);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_310);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                   ,0xa8,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_320);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_320);
                      }
                      gtest_ar_1.message_.ptr_._5_3_ = 0;
                      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
                      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                        local_340 = 30000.0;
                        testing::internal::EqHelper<false>::Compare<double,double>
                                  ((EqHelper<false> *)local_338,"mock.lxr.tk.num","30000.0",
                                   (double *)&mock.lxr.tk.length,&local_340);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_338);
                        if (!bVar1) {
                          testing::Message::Message(&local_348);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_338);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                     ,0xa9,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_348);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_348);
                        }
                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
                        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                          lex_next((Lexer *)&mock.vm.stack_size);
                          local_364 = TK_NUM;
                          testing::internal::EqHelper<false>::Compare<int,multi_tks>
                                    ((EqHelper<false> *)local_360,"mock.lxr.tk.type","TK_NUM",
                                     &mock.lxr.cursor,&local_364);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_360);
                          if (!bVar1) {
                            testing::Message::Message(&local_370);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_360);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                       ,0xaa,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_370);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_370);
                          }
                          gtest_ar_1.message_.ptr_._5_3_ = 0;
                          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                            local_390 = 30000.0;
                            testing::internal::EqHelper<false>::Compare<double,double>
                                      ((EqHelper<false> *)local_388,"mock.lxr.tk.num","30000.0",
                                       (double *)&mock.lxr.tk.length,&local_390);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_388);
                            if (!bVar1) {
                              testing::Message::Message(&local_398);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_388);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                         ,0xab,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,&local_398);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(&local_398);
                            }
                            gtest_ar_1.message_.ptr_._5_3_ = 0;
                            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_388)
                            ;
                            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                              lex_next((Lexer *)&mock.vm.stack_size);
                              local_3b4 = TK_NUM;
                              testing::internal::EqHelper<false>::Compare<int,multi_tks>
                                        ((EqHelper<false> *)local_3b0,"mock.lxr.tk.type","TK_NUM",
                                         &mock.lxr.cursor,&local_3b4);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_3b0);
                              if (!bVar1) {
                                testing::Message::Message(&local_3c0);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_3b0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                           ,0xac,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_3c0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_3c0);
                              }
                              gtest_ar_1.message_.ptr_._5_3_ = 0;
                              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_3b0);
                              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                local_3e0 = 0.0003;
                                testing::internal::EqHelper<false>::Compare<double,double>
                                          ((EqHelper<false> *)local_3d8,"mock.lxr.tk.num","0.0003",
                                           (double *)&mock.lxr.tk.length,&local_3e0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_3d8);
                                if (!bVar1) {
                                  testing::Message::Message(&local_3e8);
                                  pcVar2 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_3d8);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                             ,0xad,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_16.message_,&local_3e8);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_);
                                  testing::Message::~Message(&local_3e8);
                                }
                                gtest_ar_1.message_.ptr_._5_3_ = 0;
                                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_3d8);
                                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                  lex_next((Lexer *)&mock.vm.stack_size);
                                  local_404 = TK_NUM;
                                  testing::internal::EqHelper<false>::Compare<int,multi_tks>
                                            ((EqHelper<false> *)local_400,"mock.lxr.tk.type",
                                             "TK_NUM",&mock.lxr.cursor,&local_404);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_400);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_410);
                                    pcVar2 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_400);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                               ,0xae,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_17.message_,&local_410);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_);
                                    testing::Message::~Message(&local_410);
                                  }
                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_400);
                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                    local_430 = 314.0;
                                    testing::internal::EqHelper<false>::Compare<double,double>
                                              ((EqHelper<false> *)local_428,"mock.lxr.tk.num",
                                               "314.0",(double *)&mock.lxr.tk.length,&local_430);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_428);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_438);
                                      pcVar2 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_428);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                 ,0xaf,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_18.message_,&local_438);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_);
                                      testing::Message::~Message(&local_438);
                                    }
                                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_428);
                                    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                      lex_next((Lexer *)&mock.vm.stack_size);
                                      local_454 = TK_NUM;
                                      testing::internal::EqHelper<false>::Compare<int,multi_tks>
                                                ((EqHelper<false> *)local_450,"mock.lxr.tk.type",
                                                 "TK_NUM",&mock.lxr.cursor,&local_454);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_450);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_460);
                                        pcVar2 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_450);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb0,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_19.message_,&local_460)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_);
                                        testing::Message::~Message(&local_460);
                                      }
                                      gtest_ar_1.message_.ptr_._5_3_ = 0;
                                      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_450);
                                      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                        local_480 = 4251.0;
                                        testing::internal::EqHelper<false>::Compare<double,double>
                                                  ((EqHelper<false> *)local_478,"mock.lxr.tk.num",
                                                   "4251.0",(double *)&mock.lxr.tk.length,&local_480
                                                  );
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_478);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_488);
                                          pcVar2 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_478);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_20.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb1,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_20.message_,
                                                     &local_488);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_20.message_);
                                          testing::Message::~Message(&local_488);
                                        }
                                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_478);
                                        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                          lex_next((Lexer *)&mock.vm.stack_size);
                                          local_4a4 = TK_EOF;
                                          testing::internal::EqHelper<false>::Compare<int,multi_tks>
                                                    ((EqHelper<false> *)local_4a0,"mock.lxr.tk.type"
                                                     ,"TK_EOF",&mock.lxr.cursor,&local_4a4);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_4a0);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_4b0);
                                            pcVar2 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_4a0);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_4b8,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_lexer.cpp"
                                                  ,0xb2,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_4b8,&local_4b0);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_4b8);
                                            testing::Message::~Message(&local_4b0);
                                          }
                                          gtest_ar_1.message_.ptr_._5_3_ = 0;
                                          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_4a0);
                                          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                            mock_free((MockLexer *)&gtest_ar.message_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(Lexer, Floats) {
	MockLexer mock = mock_new("3.0 4.0000 3.1415926535 3. 42.09 3e4 3e+4 "
		"3e-4 3.14e2 42.51E2");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 4.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.1415926535);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 3.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 42.09);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 30000.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 30000.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 0.0003);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 314.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_NUM);
	ASSERT_EQ(mock.lxr.tk.num, 4251.0);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}